

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O3

void __thiscall duckdb::ReservoirSample::AddToReservoir(ReservoirSample *this,DataChunk *chunk)

{
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *this_00;
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true> *this_01;
  idx_t iVar1;
  undefined1 auVar2 [16];
  _Head_base<0UL,_duckdb::DataChunk_*,_false> _Var3;
  idx_t iVar4;
  pointer pBVar5;
  DataChunk *pDVar6;
  pointer pDVar7;
  Allocator *allocator;
  type pDVar8;
  pointer pRVar9;
  ulong uVar10;
  ulong uVar11;
  pointer *__ptr;
  sel_t sVar12;
  idx_t count;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  SelectionVectorHelper chunk_sel;
  SelectionVector input_sel;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_68;
  SelectionVectorHelper local_60;
  SelectionVector local_40;
  long lVar15;
  
  if (((this->super_BlockingSample).destroyed == false) && (chunk->count != 0)) {
    if ((this->reservoir_chunk).
        super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
        super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
        .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl ==
        (ReservoirChunk *)0x0) {
      uVar11 = this->sample_count;
      uVar10 = 0x800;
      if (uVar11 < 0x800) {
        uVar10 = uVar11;
      }
      if ((ulong)(uint)((int)uVar10 * 2) * 5 + uVar11 == 0) {
        return;
      }
    }
    iVar4 = FillReservoir(this,chunk);
    this_00 = &(this->super_BlockingSample).base_reservoir_sample;
    pBVar5 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    pBVar5->num_entries_seen_total = pBVar5->num_entries_seen_total + iVar4;
    if (iVar4 != chunk->count) {
      if (iVar4 == 0) {
        this_01 = &this->reservoir_chunk;
        pRVar9 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                 ::operator->(this_01);
        GetReplacementIndexes(&local_60,this,(pRVar9->chunk).count,chunk->count);
        if ((ulong)local_60.size == 0) {
          iVar4 = chunk->count;
          pBVar5 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                   ::operator->(this_00);
          pBVar5->num_entries_seen_total = pBVar5->num_entries_seen_total + iVar4;
        }
        else {
          pDVar6 = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                    ::operator->(this_01)->chunk;
          UpdateSampleAppend(this,pDVar6,chunk,&local_60.sel,(ulong)local_60.size);
          iVar4 = chunk->count;
          pBVar5 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                   ::operator->(this_00);
          pBVar5->num_entries_seen_total = pBVar5->num_entries_seen_total + iVar4;
          pBVar5 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                   ::operator->(this_00);
          if (((pBVar5->reservoir_weights).c.
               super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               (pBVar5->reservoir_weights).c.
               super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             (pBVar5 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                       ::operator->(this_00), 0x1dfff < pBVar5->num_entries_seen_total)) {
            ConvertToReservoirSample(this);
          }
          pRVar9 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                   ::operator->(this_01);
          uVar11 = this->sample_count;
          uVar10 = 0x800;
          if (uVar11 < 0x800) {
            uVar10 = uVar11;
          }
          if ((long)(uVar11 + (uVar10 * 5 & 0xffffffff) * 2 + -0x1800) <=
              (long)(pRVar9->chunk).count) {
            Vacuum(this);
          }
        }
        if (local_60.sel.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_60.sel.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      else {
        pDVar6 = (DataChunk *)operator_new(0x40);
        DataChunk::DataChunk(pDVar6);
        iVar1 = chunk->count;
        local_68._M_head_impl = pDVar6;
        DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_60,chunk);
        count = iVar1 - iVar4;
        SelectionVector::SelectionVector(&local_40,count);
        auVar2 = _DAT_012b0ff0;
        if (iVar1 != iVar4) {
          lVar15 = count - 1;
          auVar13._8_4_ = (int)lVar15;
          auVar13._0_8_ = lVar15;
          auVar13._12_4_ = (int)((ulong)lVar15 >> 0x20);
          uVar11 = 0;
          auVar13 = auVar13 ^ _DAT_012b0ff0;
          auVar14 = _DAT_012b0fe0;
          do {
            auVar16 = auVar14 ^ auVar2;
            sVar12 = (sel_t)iVar4;
            if ((bool)(~(auVar16._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar16._0_4_ ||
                        auVar13._4_4_ < auVar16._4_4_) & 1)) {
              local_40.sel_vector[uVar11] = sVar12;
            }
            if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
                auVar16._12_4_ <= auVar13._12_4_) {
              local_40.sel_vector[uVar11 + 1] = sVar12 + 1;
            }
            uVar11 = uVar11 + 2;
            lVar15 = auVar14._8_8_;
            auVar14._0_8_ = auVar14._0_8_ + 2;
            auVar14._8_8_ = lVar15 + 2;
            iVar4 = (idx_t)(sVar12 + 2);
          } while ((count + 1 & 0xfffffffffffffffe) != uVar11);
        }
        pDVar7 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&local_68);
        allocator = Allocator::DefaultAllocator();
        DataChunk::Initialize(pDVar7,allocator,(vector<duckdb::LogicalType,_true> *)&local_60,count)
        ;
        pDVar7 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&local_68);
        DataChunk::Slice(pDVar7,chunk,&local_40,count,0);
        pDVar7 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&local_68);
        pDVar7->count = count;
        pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator*((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                            *)&local_68);
        (*(this->super_BlockingSample)._vptr_BlockingSample[2])(this,pDVar8);
        if (local_40.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_60);
        _Var3._M_head_impl = local_68._M_head_impl;
        if (local_68._M_head_impl != (DataChunk *)0x0) {
          DataChunk::~DataChunk(local_68._M_head_impl);
          operator_delete(_Var3._M_head_impl);
        }
      }
    }
  }
  return;
}

Assistant:

void ReservoirSample::AddToReservoir(DataChunk &chunk) {
	if (destroyed || chunk.size() == 0) {
		return;
	}

	if (!reservoir_chunk && GetReservoirChunkCapacity<idx_t>() == 0) {
		return;
	}
	idx_t tuples_consumed = FillReservoir(chunk);
	base_reservoir_sample->num_entries_seen_total += tuples_consumed;
	D_ASSERT(sample_count == 0 || reservoir_chunk->chunk.size() >= 1);

	if (tuples_consumed == chunk.size()) {
		return;
	}

	// the chunk filled the first FIXED_SAMPLE_SIZE chunk but still has tuples remaining
	// slice the chunk and call AddToReservoir again.
	if (tuples_consumed != chunk.size() && tuples_consumed != 0) {
		// Fill reservoir consumed some of the chunk to reach FIXED_SAMPLE_SIZE
		// now we need to
		// So we slice it and call AddToReservoir
		auto slice = make_uniq<DataChunk>();
		auto samples_remaining = chunk.size() - tuples_consumed;
		auto types = chunk.GetTypes();
		SelectionVector input_sel(samples_remaining);
		for (idx_t i = 0; i < samples_remaining; i++) {
			input_sel.set_index(i, tuples_consumed + i);
		}
		slice->Initialize(Allocator::DefaultAllocator(), types, samples_remaining);
		slice->Slice(chunk, input_sel, samples_remaining);
		slice->SetCardinality(samples_remaining);
		AddToReservoir(*slice);
		return;
	}

	// at this point we should have collected at least sample count samples
	D_ASSERT(GetActiveSampleCount() >= sample_count);

	auto chunk_sel = GetReplacementIndexes(reservoir_chunk->chunk.size(), chunk.size());

	if (chunk_sel.size == 0) {
		// not adding any samples
		base_reservoir_sample->num_entries_seen_total += chunk.size();
		return;
	}

	idx_t size = chunk_sel.size;
	D_ASSERT(size <= chunk.size());
	D_ASSERT(reservoir_chunk->chunk.size() < GetReservoirChunkCapacity<idx_t>());

	UpdateSampleAppend(reservoir_chunk->chunk, chunk, chunk_sel.sel, size);

	base_reservoir_sample->num_entries_seen_total += chunk.size();
	D_ASSERT(base_reservoir_sample->reservoir_weights.size() == 0 ||
	         base_reservoir_sample->reservoir_weights.size() == sample_count);

	Verify();

	// if we are over the threshold, we ned to switch to slow sampling.
	if (GetSamplingState() == SamplingState::RANDOM && GetTuplesSeen() >= FIXED_SAMPLE_SIZE * FAST_TO_SLOW_THRESHOLD) {
		ConvertToReservoirSample();
	}
	if (static_cast<int64_t>(reservoir_chunk->chunk.size()) >=
	    GetReservoirChunkCapacity<int64_t>() - (static_cast<int64_t>(FIXED_SAMPLE_SIZE) * 3)) {
		Vacuum();
	}
}